

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (void)

{
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar1;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *ptrCopy;
  undefined8 *in_RDI;
  
  pPVar1 = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)operator_new(0x18);
  pPVar1->_vptr_PromiseFulfiller = (_func_int **)&PTR_fulfill_00445780;
  pPVar1[1]._vptr_PromiseFulfiller = (_func_int **)&PTR_disposeImpl_004457b0;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)0x0;
  pPVar2 = (PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)operator_new(0x1a0);
  (pPVar2->promise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  (pPVar2->promise).super_PromiseBase.node.disposer = (Disposer *)&PTR_onReady_00445810;
  (pPVar2->fulfiller).disposer = (Disposer *)&PTR_fulfill_00445858;
  *(undefined1 *)&(pPVar2->fulfiller).ptr = 0;
  *(undefined1 *)&pPVar2[0xb].fulfiller.ptr = 0;
  *(undefined1 *)&pPVar2[0xc].promise.super_PromiseBase.node.ptr = 1;
  pPVar2[0xc].fulfiller.disposer = (Disposer *)&pPVar2->fulfiller;
  pPVar2[0xc].fulfiller.ptr = pPVar1;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)&pPVar2->fulfiller;
  *in_RDI = &_::
             HeapDisposer<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
             ::instance;
  in_RDI[1] = pPVar2;
  in_RDI[2] = pPVar1 + 1;
  in_RDI[3] = pPVar1;
  return pPVar2;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}